

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O3

FT_Error tt_sbit_decoder_load_compound
                   (TT_SBitDecoder decoder,FT_Byte *p,FT_Byte *limit,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count)

{
  FT_Byte *pFVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  FT_UShort FVar8;
  FT_UShort FVar9;
  FT_Error FVar10;
  TT_SBit_Metrics pTVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  
  pFVar1 = p + 2;
  FVar10 = 3;
  if (pFVar1 <= limit) {
    bVar4 = *p;
    bVar5 = p[1];
    uVar14 = (uint)bVar4 * 0x100 + (uint)bVar5;
    if (pFVar1 + (ulong)uVar14 * 4 <= limit) {
      pTVar11 = decoder->metrics;
      uVar6._0_2_ = pTVar11->horiBearingX;
      uVar6._2_2_ = pTVar11->horiBearingY;
      FVar8 = pTVar11->horiAdvance;
      uVar7._0_2_ = pTVar11->vertBearingX;
      uVar7._2_2_ = pTVar11->vertBearingY;
      FVar9 = pTVar11->vertAdvance;
      if (uVar14 == 0) {
        FVar10 = 0;
      }
      else {
        lVar13 = 0;
        do {
          FVar10 = tt_sbit_decoder_load_image
                             (decoder,(uint)(ushort)(*(ushort *)(pFVar1 + lVar13 * 4) << 8 |
                                                    *(ushort *)(pFVar1 + lVar13 * 4) >> 8),
                              (char)p[lVar13 * 4 + 4] + x_pos,(char)p[lVar13 * 4 + 5] + y_pos,
                              recurse_count + 1,'\0');
          if (FVar10 != 0) break;
          iVar12 = (int)lVar13;
          lVar13 = lVar13 + 1;
        } while (CONCAT11(bVar4,bVar5) - 1 != iVar12);
        pTVar11 = decoder->metrics;
      }
      auVar15 = psllw(ZEXT416(uVar6),8);
      auVar15 = psraw(auVar15,8);
      pTVar11->horiBearingX = (short)auVar15._0_4_;
      pTVar11->horiBearingY = (short)((uint)auVar15._0_4_ >> 0x10);
      pTVar11->horiAdvance = (ushort)(byte)FVar8;
      auVar15 = psllw(ZEXT416(uVar7),8);
      auVar15 = psraw(auVar15,8);
      pTVar11->vertBearingX = (short)auVar15._0_4_;
      pTVar11->vertBearingY = (short)((uint)auVar15._0_4_ >> 0x10);
      pTVar11->vertAdvance = (ushort)(byte)FVar9;
      uVar2 = decoder->bitmap->rows;
      uVar3 = decoder->bitmap->width;
      auVar15._4_4_ = uVar3;
      auVar15._0_4_ = uVar2;
      auVar15._8_8_ = 0;
      auVar15 = pshuflw(auVar15,auVar15,0xe8);
      uVar14 = auVar15._0_4_ & (uint)DAT_00305ec0;
      pTVar11->height = (short)uVar14;
      pTVar11->width = (short)(uVar14 >> 0x10);
    }
  }
  return FVar10;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_compound( TT_SBitDecoder  decoder,
                                 FT_Byte*        p,
                                 FT_Byte*        limit,
                                 FT_Int          x_pos,
                                 FT_Int          y_pos,
                                 FT_UInt         recurse_count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   num_components, nn;

    FT_Char  horiBearingX = (FT_Char)decoder->metrics->horiBearingX;
    FT_Char  horiBearingY = (FT_Char)decoder->metrics->horiBearingY;
    FT_Byte  horiAdvance  = (FT_Byte)decoder->metrics->horiAdvance;
    FT_Char  vertBearingX = (FT_Char)decoder->metrics->vertBearingX;
    FT_Char  vertBearingY = (FT_Char)decoder->metrics->vertBearingY;
    FT_Byte  vertAdvance  = (FT_Byte)decoder->metrics->vertAdvance;


    if ( p + 2 > limit )
      goto Fail;

    num_components = FT_NEXT_USHORT( p );
    if ( p + 4 * num_components > limit )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_compound: broken table\n" ));
      goto Fail;
    }

    FT_TRACE3(( "tt_sbit_decoder_load_compound: loading %d component%s\n",
                num_components,
                num_components == 1 ? "" : "s" ));

    for ( nn = 0; nn < num_components; nn++ )
    {
      FT_UInt  gindex = FT_NEXT_USHORT( p );
      FT_Char  dx     = FT_NEXT_CHAR( p );
      FT_Char  dy     = FT_NEXT_CHAR( p );


      /* NB: a recursive call */
      error = tt_sbit_decoder_load_image( decoder,
                                          gindex,
                                          x_pos + dx,
                                          y_pos + dy,
                                          recurse_count + 1,
                                          /* request full bitmap image */
                                          FALSE );
      if ( error )
        break;
    }

    FT_TRACE3(( "tt_sbit_decoder_load_compound: done\n" ));

    decoder->metrics->horiBearingX = horiBearingX;
    decoder->metrics->horiBearingY = horiBearingY;
    decoder->metrics->horiAdvance  = horiAdvance;
    decoder->metrics->vertBearingX = vertBearingX;
    decoder->metrics->vertBearingY = vertBearingY;
    decoder->metrics->vertAdvance  = vertAdvance;
    decoder->metrics->width        = (FT_Byte)decoder->bitmap->width;
    decoder->metrics->height       = (FT_Byte)decoder->bitmap->rows;

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }